

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

int CompareValueId(ON_Value **a,ON_Value **b)

{
  ON_Value **b_local;
  ON_Value **a_local;
  
  if (a == (ON_Value **)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_Value **)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_Value **)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = CompareValueIdHelper(*a,*b);
  }
  return a_local._4_4_;
}

Assistant:

static int CompareValueId( ON_Value * const * a, ON_Value * const * b )
{
  // handle NULLs in case somebody messes up the m_value[] array.
  if ( !a )
  {
    return b ? -1 : 0;
  }
  if (!b)
    return 1;

  return CompareValueIdHelper(*a,*b);
}